

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void CTPNVarIn::gen_iter_init(CTcPrsNode *coll_expr,int iter_local_id,char *kw)

{
  CTcPrsNode *pCVar1;
  
  pCVar1 = CTcGenTarg::get_metaclass_prop(G_cg,"collection",0);
  if (pCVar1 != (CTcPrsNode *)0x0) {
    if (coll_expr != (CTcPrsNode *)0x0) {
      (*(coll_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x17])(coll_expr,0,pCVar1,0,0,0,0);
    }
    CTcSymLocal::s_gen_code_setlcl_stk(iter_local_id,0);
    return;
  }
  CTcTokenizer::log_error(0x2d18,kw);
  return;
}

Assistant:

void CTPNVarIn::gen_iter_init(CTcPrsNode *coll_expr, int iter_local_id,
                              const char *kw)
{
    /* 
     *   Look up the createIterator property of the Collection metaclass.
     *   This property is defined by the Collection specification as the
     *   property in the first (zeroeth) slot in the method table for
     *   Collection.  If Collection isn't defined, or this slot isn't
     *   defined, it's an error.  
     */
    CTcPrsNode *create_iter = G_cg->get_metaclass_prop("collection", 0);

    /* if we didn't find the property, it's an error */
    if (create_iter != 0)
    {
        /* 
         *   generate a call to the createIterator() property on the
         *   collection expression 
         */
        if (coll_expr != 0)
            coll_expr->gen_code_member(FALSE, create_iter, FALSE, 0, FALSE, 0);

        /* assign the result to the internal iterator stack local */
        CTcSymLocal::s_gen_code_setlcl_stk(iter_local_id, FALSE);
    }
    else
    {
        /* tell them about the problem */
        G_tok->log_error(TCERR_FOREACH_NO_CREATEITER, kw);
    }
}